

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::StrPair::GetStr(StrPair *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  size_t __n;
  char *p;
  char *__dest;
  bool bVar9;
  int len;
  char buf [10];
  
  if ((this->_flags & 0x100) != 0) {
    *this->_end = '\0';
    uVar2 = this->_flags;
    this->_flags = uVar2 ^ 0x100;
    uVar3 = 0;
    if (uVar2 != 0x100) {
      __dest = this->_start;
      p = __dest;
      while (p < this->_end) {
        cVar1 = *p;
        if ((this->_flags & 2U) == 0) {
LAB_001b65f1:
          if (((this->_flags & 1U) == 0) || (cVar1 != '&')) {
            *__dest = cVar1;
            p = p + 1;
            __dest = __dest + 1;
          }
          else {
            pcVar8 = p + 1;
            if (p[1] == '#') {
              buf[8] = '\0';
              buf[9] = '\0';
              buf[0] = '\0';
              buf[1] = '\0';
              buf[2] = '\0';
              buf[3] = '\0';
              buf[4] = '\0';
              buf[5] = '\0';
              buf[6] = '\0';
              buf[7] = '\0';
              len = 0;
              pcVar5 = XMLUtil::GetCharacterRef(p,buf,&len);
              if (pcVar5 == (char *)0x0) {
                *__dest = *p;
                lVar6 = 1;
              }
              else {
                memcpy(__dest,buf,(long)len);
                lVar6 = (long)len;
                pcVar8 = pcVar5;
              }
              __dest = __dest + lVar6;
              p = pcVar8;
            }
            else {
              pcVar5 = "\"";
              for (uVar7 = 0; uVar7 != 5; uVar7 = uVar7 + 1) {
                __n = (size_t)*(int *)(pcVar5 + -4);
                iVar4 = strncmp(pcVar8,*(char **)(pcVar5 + -0xc),__n);
                if ((iVar4 == 0) && (pcVar8[__n] == ';')) {
                  uVar7 = (ulong)(4 < uVar7);
                  *__dest = *pcVar5;
                  __dest = __dest + 1;
                  p = p + __n + 2;
                  goto LAB_001b66e1;
                }
                pcVar5 = pcVar5 + 0x10;
              }
              uVar7 = 1;
LAB_001b66e1:
              __dest = __dest + uVar7;
              p = p + uVar7;
            }
          }
        }
        else {
          if (cVar1 == '\n') {
            bVar9 = p[1] == '\r';
          }
          else {
            if (cVar1 != '\r') goto LAB_001b65f1;
            bVar9 = p[1] == '\n';
          }
          pcVar8 = p + 1;
          if (bVar9) {
            pcVar8 = p + 2;
          }
          *__dest = '\n';
          __dest = __dest + 1;
          p = pcVar8;
        }
      }
      *__dest = '\0';
      uVar3 = this->_flags;
      if ((uVar3 & 4) != 0) {
        CollapseWhitespace(this);
        uVar3 = this->_flags;
      }
    }
    this->_flags = uVar3 & 0x200;
  }
  return this->_start;
}

Assistant:

const char* StrPair::GetStr()
{
    TIXMLASSERT( _start );
    TIXMLASSERT( _end );
    if ( _flags & NEEDS_FLUSH ) {
        *_end = 0;
        _flags ^= NEEDS_FLUSH;

        if ( _flags ) {
            const char* p = _start;	// the read pointer
            char* q = _start;	// the write pointer

            while( p < _end ) {
                if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == CR ) {
                    // CR-LF pair becomes LF
                    // CR alone becomes LF
                    // LF-CR becomes LF
                    if ( *(p+1) == LF ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                }
                else if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == LF ) {
                    if ( *(p+1) == CR ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                }
                else if ( (_flags & NEEDS_ENTITY_PROCESSING) && *p == '&' ) {
                    // Entities handled by tinyXML2:
                    // - special entities in the entity table [in/out]
                    // - numeric character reference [in]
                    //   &#20013; or &#x4e2d;

                    if ( *(p+1) == '#' ) {
                        const int buflen = 10;
                        char buf[buflen] = { 0 };
                        int len = 0;
                        const char* adjusted = const_cast<char*>( XMLUtil::GetCharacterRef( p, buf, &len ) );
                        if ( adjusted == 0 ) {
                            *q = *p;
                            ++p;
                            ++q;
                        }
                        else {
                            TIXMLASSERT( 0 <= len && len <= buflen );
                            TIXMLASSERT( q + len <= adjusted );
                            p = adjusted;
                            memcpy( q, buf, len );
                            q += len;
                        }
                    }
                    else {
                        bool entityFound = false;
                        for( int i = 0; i < NUM_ENTITIES; ++i ) {
                            const Entity& entity = entities[i];
                            if ( strncmp( p + 1, entity.pattern, entity.length ) == 0
                                    && *( p + entity.length + 1 ) == ';' ) {
                                // Found an entity - convert.
                                *q = entity.value;
                                ++q;
                                p += entity.length + 2;
                                entityFound = true;
                                break;
                            }
                        }
                        if ( !entityFound ) {
                            // fixme: treat as error?
                            ++p;
                            ++q;
                        }
                    }
                }
                else {
                    *q = *p;
                    ++p;
                    ++q;
                }
            }
            *q = 0;
        }
        // The loop below has plenty going on, and this
        // is a less useful mode. Break it out.
        if ( _flags & NEEDS_WHITESPACE_COLLAPSING ) {
            CollapseWhitespace();
        }
        _flags = (_flags & NEEDS_DELETE);
    }
    TIXMLASSERT( _start );
    return _start;
}